

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Array.h
# Opt level: O2

void __thiscall
axl::sl::
ArrayRef<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink>_>_>
::attach(ArrayRef<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink>_>_>
         *this,Hdr *hdr,
        AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink>
        *p,size_t count)

{
  int32_t *piVar1;
  Hdr *this_00;
  
  this_00 = this->m_hdr;
  if (this_00 != hdr) {
    if (hdr != (Hdr *)0x0) {
      LOCK();
      piVar1 = &(hdr->super_BufHdr).super_RefCount.m_refCount;
      *piVar1 = *piVar1 + 1;
      UNLOCK();
      this_00 = this->m_hdr;
    }
    if (this_00 != (Hdr *)0x0) {
      rc::RefCount::release((RefCount *)this_00);
    }
    this->m_hdr = hdr;
  }
  this->m_p = p;
  this->m_count = count;
  return;
}

Assistant:

void
	attach(
		Hdr* hdr,
		T* p,
		size_t count
	) {
		if (hdr != m_hdr) { // try to avoid unnecessary interlocked ops
			if (hdr)
				hdr->addRef();

			if (m_hdr)
				m_hdr->release();

			m_hdr = hdr;
		}

		m_p = p;
		m_count = count;
	}